

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<phmap::priv::(anonymous_namespace)::StringTable,void>
               (StringTable *container,ostream *os)

{
  bool bVar1;
  reference value;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  StringTable *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  StringTable *container_local;
  
  std::operator<<(os,'{');
  __range3 = (StringTable *)0x0;
  join_0x00000010_0x00000000_ =
       (iterator)
       phmap::priv::
       raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
       ::begin(&container->
                super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              );
  _elem = (iterator)
          phmap::priv::
          raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
          ::end(&container->
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
               );
  do {
    bVar1 = phmap::priv::operator!=
                      ((const_iterator *)&__end0.inner_.field_1,(const_iterator *)&elem);
    if (!bVar1) {
LAB_0014613d:
      if (__range3 != (StringTable *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = phmap::priv::
            raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
            ::const_iterator::operator*[abi_cxx11_((const_iterator *)&__end0.inner_.field_1);
    if ((__range3 != (StringTable *)0x0) &&
       (std::operator<<(os,','), __range3 == (StringTable *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_0014613d;
    }
    std::operator<<(os,' ');
    UniversalPrint<std::pair<std::__cxx11::string,std::__cxx11::string>>(value,os);
    __range3 = (StringTable *)
               ((long)&(__range3->
                       super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                       ).ctrl_ + 1);
    phmap::priv::
    raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
    ::const_iterator::operator++((const_iterator *)&__end0.inner_.field_1);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }